

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O0

QDistanceFieldData * QDistanceFieldData::create(QSize size,QPainterPath *path,bool doubleResolution)

{
  long lVar1;
  QDistanceFieldData *pQVar2;
  long in_FS_OFFSET;
  QDistanceFieldData *data;
  int in_stack_000002d0;
  int in_stack_000002d4;
  QPainterPath *in_stack_000002d8;
  QDistanceFieldData *in_stack_000002e0;
  QSize *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = create(in_stack_ffffffffffffffc0);
  QT_DISTANCEFIELD_SCALE(false);
  QT_DISTANCEFIELD_RADIUS(false);
  QT_DISTANCEFIELD_SCALE(false);
  makeDistanceField(in_stack_000002e0,in_stack_000002d8,in_stack_000002d4,in_stack_000002d0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QDistanceFieldData *QDistanceFieldData::create(QSize size, const QPainterPath &path, bool doubleResolution)
{
    QDistanceFieldData *data = create(size);
    makeDistanceField(data,
                      path,
                      QT_DISTANCEFIELD_SCALE(doubleResolution),
                      QT_DISTANCEFIELD_RADIUS(doubleResolution) / QT_DISTANCEFIELD_SCALE(doubleResolution));
    return data;
}